

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-udp-pummel.c
# Opt level: O3

int pummel(uint n_senders,uint n_receivers,unsigned_long timeout)

{
  receiver_state *prVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uv_udp_t *handle;
  sender_state *addr_00;
  double dVar7;
  sockaddr_in addr;
  uv_timer_t timer_handle;
  sockaddr_in local_d8;
  uv_timer_t local_c8;
  
  puVar3 = uv_default_loop();
  n_senders_ = n_senders;
  n_receivers_ = n_receivers;
  if (timeout == 0) {
LAB_0010d8a6:
    if (n_receivers != 0) {
      prVar1 = receivers;
      uVar6 = 0;
      do {
        handle = &prVar1->udp_handle;
        iVar2 = uv_ip4_addr("0.0.0.0",(int)uVar6 + 0x3039,&local_d8);
        if (iVar2 != 0) {
LAB_0010db41:
          pummel_cold_3();
          goto LAB_0010db46;
        }
        iVar2 = uv_udp_init(puVar3,handle);
        if (iVar2 != 0) {
LAB_0010db3c:
          pummel_cold_4();
          goto LAB_0010db41;
        }
        iVar2 = uv_udp_bind(handle,(sockaddr *)&local_d8,0);
        if (iVar2 != 0) {
LAB_0010db37:
          pummel_cold_5();
          goto LAB_0010db3c;
        }
        iVar2 = uv_udp_recv_start(handle,alloc_cb,recv_cb);
        if (iVar2 != 0) {
          pummel_cold_6();
          goto LAB_0010db37;
        }
        uv_unref((uv_handle_t *)handle);
        uVar6 = uVar6 + 1;
        prVar1 = (receiver_state *)(handle + 1);
      } while (n_receivers != uVar6);
    }
    bufs[0] = uv_buf_init("RANG TANG DING DONG I AM THE JAPANESE SANDMAN",10);
    bufs[1] = uv_buf_init("DING DONG I AM THE JAPANESE SANDMAN",10);
    bufs[2] = uv_buf_init("I AM THE JAPANESE SANDMAN",10);
    bufs[3] = uv_buf_init("APANESE SANDMAN",10);
    bufs[4] = uv_buf_init("NDMAN",5);
    if (n_senders != 0) {
      addr_00 = senders;
      uVar6 = 0;
      do {
        iVar2 = uv_ip4_addr("127.0.0.1",(int)((uVar6 & 0xffffffff) % (ulong)n_receivers) + 0x3039,
                            &addr_00->addr);
        if (iVar2 != 0) goto LAB_0010db50;
        iVar2 = uv_udp_init(puVar3,&addr_00->udp_handle);
        if (iVar2 != 0) goto LAB_0010db4b;
        iVar2 = uv_udp_send(&addr_00->send_req,&addr_00->udp_handle,bufs,5,(sockaddr *)addr_00,
                            send_cb);
        if (iVar2 != 0) goto LAB_0010db46;
        uVar6 = uVar6 + 1;
        addr_00 = addr_00 + 1;
      } while (n_senders != uVar6);
    }
    uVar4 = uv_hrtime();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0010db55;
    uVar5 = uv_hrtime();
    dVar7 = (double)((uVar5 - uVar4) / 1000000) / 1000.0;
    printf("udp_pummel_%dv%d: %.0f/s received, %.0f/s sent. %u received, %u sent in %.1f seconds.\n"
           ,(double)recv_cb_called / dVar7,(double)send_cb_called / dVar7,(ulong)n_receivers,
           (ulong)n_senders);
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return extraout_EAX;
    }
    goto LAB_0010db5a;
  }
  iVar2 = uv_timer_init(puVar3,&local_c8);
  if (iVar2 == 0) {
    iVar2 = uv_timer_start(&local_c8,timeout_cb,timeout,0);
    if (iVar2 != 0) goto LAB_0010db64;
    uv_unref((uv_handle_t *)&local_c8);
    timed = 1;
    goto LAB_0010d8a6;
  }
  goto LAB_0010db5f;
LAB_0010db46:
  pummel_cold_9();
LAB_0010db4b:
  pummel_cold_8();
LAB_0010db50:
  pummel_cold_7();
LAB_0010db55:
  pummel_cold_10();
LAB_0010db5a:
  pummel_cold_11();
LAB_0010db5f:
  pummel_cold_1();
LAB_0010db64:
  pummel_cold_2();
  pummel(1,1,5000);
  return 0;
}

Assistant:

static int pummel(unsigned int n_senders,
                  unsigned int n_receivers,
                  unsigned long timeout) {
  uv_timer_t timer_handle;
  uint64_t duration;
  uv_loop_t* loop;
  unsigned int i;

  ASSERT(n_senders <= ARRAY_SIZE(senders));
  ASSERT(n_receivers <= ARRAY_SIZE(receivers));

  loop = uv_default_loop();

  n_senders_ = n_senders;
  n_receivers_ = n_receivers;

  if (timeout) {
    ASSERT(0 == uv_timer_init(loop, &timer_handle));
    ASSERT(0 == uv_timer_start(&timer_handle, timeout_cb, timeout, 0));
    /* Timer should not keep loop alive. */
    uv_unref((uv_handle_t*)&timer_handle);
    timed = 1;
  }

  for (i = 0; i < n_receivers; i++) {
    struct receiver_state* s = receivers + i;
    struct sockaddr_in addr;
    ASSERT(0 == uv_ip4_addr("0.0.0.0", BASE_PORT + i, &addr));
    ASSERT(0 == uv_udp_init(loop, &s->udp_handle));
    ASSERT(0 == uv_udp_bind(&s->udp_handle, (const struct sockaddr*) &addr, 0));
    ASSERT(0 == uv_udp_recv_start(&s->udp_handle, alloc_cb, recv_cb));
    uv_unref((uv_handle_t*)&s->udp_handle);
  }

  bufs[0] = uv_buf_init(&EXPECTED[0],  10);
  bufs[1] = uv_buf_init(&EXPECTED[10], 10);
  bufs[2] = uv_buf_init(&EXPECTED[20], 10);
  bufs[3] = uv_buf_init(&EXPECTED[30], 10);
  bufs[4] = uv_buf_init(&EXPECTED[40], 5);

  for (i = 0; i < n_senders; i++) {
    struct sender_state* s = senders + i;
    ASSERT(0 == uv_ip4_addr("127.0.0.1",
                            BASE_PORT + (i % n_receivers),
                            &s->addr));
    ASSERT(0 == uv_udp_init(loop, &s->udp_handle));
    ASSERT(0 == uv_udp_send(&s->send_req,
                            &s->udp_handle,
                            bufs,
                            ARRAY_SIZE(bufs),
                            (const struct sockaddr*) &s->addr,
                            send_cb));
  }

  duration = uv_hrtime();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  duration = uv_hrtime() - duration;
  /* convert from nanoseconds to milliseconds */
  duration = duration / (uint64_t) 1e6;

  printf("udp_pummel_%dv%d: %.0f/s received, %.0f/s sent. "
         "%u received, %u sent in %.1f seconds.\n",
         n_receivers,
         n_senders,
         recv_cb_called / (duration / 1000.0),
         send_cb_called / (duration / 1000.0),
         recv_cb_called,
         send_cb_called,
         duration / 1000.0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}